

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::InternalUncompress<duckdb_snappy::SnappyArrayWriter>
               (Source *r,SnappyArrayWriter *writer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 in_RSI;
  Source *in_RDI;
  uint32_t uncompressed_len;
  SnappyDecompressor decompressor;
  SnappyDecompressor *this;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SnappyDecompressor *in_stack_ffffffffffffffa8;
  SnappyDecompressor local_48;
  undefined8 local_18;
  Source *local_10;
  bool local_1;
  
  this = &local_48;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SnappyDecompressor::SnappyDecompressor(this,in_RDI);
  bVar1 = SnappyDecompressor::ReadUncompressedLength
                    (in_stack_ffffffffffffffa8,
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    iVar2 = (*local_10->_vptr_Source[2])();
    local_1 = InternalUncompressAllTags<duckdb_snappy::SnappyArrayWriter>
                        (this,(SnappyArrayWriter *)CONCAT44(extraout_var,iVar2),
                         (uint32_t)((ulong)local_18 >> 0x20),(uint32_t)local_18);
  }
  else {
    local_1 = false;
  }
  SnappyDecompressor::~SnappyDecompressor((SnappyDecompressor *)0x741de6);
  return (bool)(local_1 & 1);
}

Assistant:

static bool InternalUncompress(Source* r, Writer* writer) {
  // Read the uncompressed length from the front of the compressed input
  SnappyDecompressor decompressor(r);
  uint32_t uncompressed_len = 0;
  if (!decompressor.ReadUncompressedLength(&uncompressed_len)) return false;

  return InternalUncompressAllTags(&decompressor, writer, r->Available(),
                                   uncompressed_len);
}